

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_union_ref_t *
flatcc_builder_union_vector_push(flatcc_builder_t *B,flatcc_builder_union_ref_t uref)

{
  flatcc_builder_union_ref_t *p;
  flatcc_builder_t *B_local;
  flatcc_builder_union_ref_t uref_local;
  
  if (B->frame->type == 7) {
    if ((B->frame->container).table.pl_end == 0x1fffffff) {
      uref_local.type = '\0';
      uref_local._1_3_ = 0;
      uref_local.value = 0;
    }
    else {
      (B->frame->container).table.pl_end = (B->frame->container).table.pl_end + 1;
      uref_local = (flatcc_builder_union_ref_t)push_ds(B,8);
      if (uref_local == (flatcc_builder_union_ref_t)0x0) {
        uref_local.type = '\0';
        uref_local._1_3_ = 0;
        uref_local.value = 0;
      }
      else {
        *(flatcc_builder_union_ref_t *)uref_local = uref;
      }
    }
    return (flatcc_builder_union_ref_t *)uref_local;
  }
  __assert_fail("(B->frame[0].type) == flatcc_builder_union_vector",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x6b2,
                "flatcc_builder_union_ref_t *flatcc_builder_union_vector_push(flatcc_builder_t *, flatcc_builder_union_ref_t)"
               );
}

Assistant:

flatcc_builder_union_ref_t *flatcc_builder_union_vector_push(flatcc_builder_t *B,
        flatcc_builder_union_ref_t uref)
{
    flatcc_builder_union_ref_t *p;

    check(frame(type) == flatcc_builder_union_vector, "expected union vector frame");
    if (frame(container.vector.count) == max_union_count) {
        return 0;
    }
    frame(container.vector.count) += 1;
    if (0 == (p = push_ds(B, union_size))) {
        return 0;
    }
    *p = uref;
    return p;
}